

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanLogicalDevice::FreeDescriptorSet
          (VulkanLogicalDevice *this,VkDescriptorPool Pool,VkDescriptorSet Set)

{
  Char *Message;
  char (*in_RCX) [48];
  undefined1 local_40 [8];
  string msg;
  VkDescriptorSet Set_local;
  VkDescriptorPool Pool_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = Set;
  if ((Pool == (VkDescriptorPool)0x0) || (Set == (VkDescriptorSet)0x0)) {
    Diligent::FormatString<char[26],char[48]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Pool != VK_NULL_HANDLE && Set != VK_NULL_HANDLE",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"FreeDescriptorSet",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x232);
    std::__cxx11::string::~string((string *)local_40);
  }
  (*vkFreeDescriptorSets)(this->m_VkDevice,Pool,1,(VkDescriptorSet *)((long)&msg.field_2 + 8));
  return;
}

Assistant:

void VulkanLogicalDevice::FreeDescriptorSet(VkDescriptorPool Pool, VkDescriptorSet Set) const
{
    VERIFY_EXPR(Pool != VK_NULL_HANDLE && Set != VK_NULL_HANDLE);
    vkFreeDescriptorSets(m_VkDevice, Pool, 1, &Set);
}